

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

void proto2_unittest::TestRequiredForeign::SharedDtor(MessageLite *self)

{
  TestRequired *this;
  NestedTestAllTypes *this_00;
  ulong uVar1;
  LogMessageFatal local_20;
  
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    this = (TestRequired *)self[3]._vptr_MessageLite;
    if (this != (TestRequired *)0x0) {
      TestRequired::~TestRequired(this);
    }
    operator_delete(this,0xa8);
    this_00 = (NestedTestAllTypes *)self[3]._internal_metadata_.ptr_;
    if (this_00 != (NestedTestAllTypes *)0x0) {
      NestedTestAllTypes::~NestedTestAllTypes(this_00);
    }
    operator_delete(this_00,0x50);
    google::protobuf::RepeatedPtrField<proto2_unittest::TestRequired>::~RepeatedPtrField
              ((RepeatedPtrField<proto2_unittest::TestRequired> *)&self[1]._internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest.pb.cc"
             ,0x4a74,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline void TestRequiredForeign::SharedDtor(MessageLite& self) {
  TestRequiredForeign& this_ = static_cast<TestRequiredForeign&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.optional_message_;
  delete this_._impl_.optional_lazy_message_;
  this_._impl_.~Impl_();
}